

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer.cc
# Opt level: O0

void __thiscall MutableBuffer::push(MutableBuffer *this,string *str)

{
  void *_data;
  size_t _size;
  string *str_local;
  MutableBuffer *this_local;
  
  _data = (void *)std::__cxx11::string::c_str();
  _size = std::__cxx11::string::size();
  push(this,_data,_size);
  return;
}

Assistant:

void
MutableBuffer::push(const std::string &str) {
  push((const void*)str.c_str(), str.size());
}